

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextLineComment(Lexer *this)

{
  Lexer *in_RSI;
  bool bVar1;
  Lexer *this_local;
  
  nextChar(in_RSI);
  if ((in_RSI->currentChar == 0x2a) || (in_RSI->currentChar == 0x21)) {
    nextLineCommentDoc(this);
  }
  else {
    while( true ) {
      bVar1 = false;
      if ((in_RSI->currentChar != -1) && (bVar1 = false, in_RSI->currentChar != 10)) {
        bVar1 = in_RSI->currentChar != 0xd;
      }
      if (!bVar1) break;
      nextChar(in_RSI);
    }
    nextToken(this);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextLineComment() noexcept {
  nextChar(); // eat /
  if (currentChar == '*' || currentChar == '!')
    return nextLineCommentDoc();

  while (currentChar != EOF && currentChar != '\n' && currentChar != '\r')
    nextChar();

  return nextToken();
}